

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astPragmaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  size_t i;
  sysbvm_tuple_t sVar6;
  anon_struct_72_9_6444e132 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.literalPragmaArguments = 0;
  gcFrame.literalPragma = 0;
  gcFrame.analyzedArguments = 0;
  gcFrame.literalPragmaSelector = 0;
  gcFrame.argumentNode = 0;
  gcFrame.analyzedArgument = 0;
  gcFrame.pragmaNode = (sysbvm_astPragmaNode_t *)0x0;
  gcFrame.analyzedSelector = 0;
  gcFrame.literalPragmaNode = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 9;
  local_40 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_58);
  gcFrame.pragmaNode = (sysbvm_astPragmaNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.pragmaNode)->super).analyzerToken = sVar4;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.pragmaNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.analyzedSelector =
       sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                 (context,(gcFrame.pragmaNode)->selector,(context->roots).symbolType,arguments[1]);
  _Var3 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedSelector);
  uVar1 = (gcFrame.pragmaNode)->arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar4 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    sVar4 = 0;
  }
  gcFrame.analyzedArguments = sysbvm_array_create(context,sVar4);
  for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
    uVar1 = (gcFrame.pragmaNode)->arguments;
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar6 * 8);
    }
    else {
      gcFrame.argumentNode = 0;
    }
    gcFrame.analyzedArgument =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,gcFrame.argumentNode,arguments[1]);
    if (_Var3 == false) {
      _Var3 = false;
    }
    else {
      _Var3 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedArgument);
    }
    if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
      *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + sVar6 * 8) = gcFrame.analyzedArgument;
    }
  }
  if (_Var3 == false) {
    (gcFrame.pragmaNode)->arguments = gcFrame.analyzedArguments;
    ((gcFrame.pragmaNode)->super).analyzedType = (context->roots).pragmaType;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
    gcFrame.literalPragmaNode = (sysbvm_tuple_t)gcFrame.pragmaNode;
  }
  else {
    gcFrame.literalPragmaSelector = sysbvm_astLiteralNode_getValue(gcFrame.analyzedSelector);
    gcFrame.literalPragmaArguments = sysbvm_array_create(context,sVar4);
    for (sVar6 = 0; sVar2 = gcFrame.literalPragmaArguments, sVar4 != sVar6; sVar6 = sVar6 + 1) {
      if ((gcFrame.analyzedArguments & 0xf) == 0 && gcFrame.analyzedArguments != 0) {
        sVar5 = *(sysbvm_tuple_t *)(gcFrame.analyzedArguments + 0x10 + sVar6 * 8);
      }
      else {
        sVar5 = 0;
      }
      sVar5 = sysbvm_astLiteralNode_getValue(sVar5);
      if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
        *(sysbvm_tuple_t *)(sVar2 + 0x10 + sVar6 * 8) = sVar5;
      }
    }
    gcFrame.literalPragma =
         sysbvm_pragma_create(context,gcFrame.literalPragmaSelector,gcFrame.literalPragmaArguments);
    gcFrame.literalPragmaNode =
         sysbvm_astLiteralNode_create
                   (context,((gcFrame.pragmaNode)->super).sourcePosition,gcFrame.literalPragma);
    sysbvm_analysisEnvironment_addPragma(context,arguments[1],gcFrame.literalPragma);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
  }
  return gcFrame.literalPragmaNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astPragmaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astPragmaNode_t *pragmaNode;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t literalPragmaSelector;
        sysbvm_tuple_t literalPragmaArguments;
        sysbvm_tuple_t literalPragma;
        sysbvm_tuple_t literalPragmaNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.pragmaNode = (sysbvm_astPragmaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.pragmaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.pragmaNode->super.sourcePosition);

    gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragmaNode->selector, context->roots.symbolType, *environment);
    bool isLiteral = sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedSelector);

    size_t pragmaArgumentCount = sysbvm_array_getSize(gcFrame.pragmaNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, pragmaArgumentCount);
    for(size_t i = 0; i < pragmaArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.pragmaNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        isLiteral = isLiteral && sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedArgument);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    if(isLiteral)
    {
        gcFrame.literalPragmaSelector = sysbvm_astLiteralNode_getValue(gcFrame.analyzedSelector);
        gcFrame.literalPragmaArguments = sysbvm_array_create(context, pragmaArgumentCount);
        for(size_t i = 0; i < pragmaArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.literalPragmaArguments, i, sysbvm_astLiteralNode_getValue(sysbvm_array_at(gcFrame.analyzedArguments, i)));
        
        gcFrame.literalPragma = sysbvm_pragma_create(context, gcFrame.literalPragmaSelector, gcFrame.literalPragmaArguments);
        gcFrame.literalPragmaNode = sysbvm_astLiteralNode_create(context, gcFrame.pragmaNode->super.sourcePosition, gcFrame.literalPragma);
        sysbvm_analysisEnvironment_addPragma(context, *environment, gcFrame.literalPragma);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.literalPragmaNode;
    }

    gcFrame.pragmaNode->arguments = gcFrame.analyzedArguments;
    gcFrame.pragmaNode->super.analyzedType = context->roots.pragmaType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.pragmaNode;
}